

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O3

void __thiscall
mp::SolverOptionManager::AddIntOption<mp::BasicSolver,int>
          (SolverOptionManager *this,char *name,char *description,Get get,
          offset_in_BasicSolver_to_subr set)

{
  tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_> this_00;
  size_type in_stack_00000008;
  undefined8 in_stack_00000010;
  __uniq_ptr_impl<mp::SolverOption,_std::default_delete<mp::SolverOption>_> local_50;
  size_type local_48;
  undefined8 uStack_40;
  
  local_48 = in_stack_00000008;
  uStack_40 = in_stack_00000010;
  this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       operator_new(0xf8);
  SolverOption::SolverOption
            ((SolverOption *)
             this_00.
             super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
             super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl,name,description,
             (ValueArrayRef)ZEXT816(0),false);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
   super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl = &PTR__SolverOption_005d4a40;
  ((SolverOption *)
  ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
         super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xd0))->_vptr_SolverOption
       = (_func_int **)&this[-1].options_._M_t._M_impl.super__Rb_tree_header;
  (((string *)
   ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xd8))->_M_dataplus)._M_p
       = (pointer)get;
  *(offset_in_BasicSolver_to_subr *)
   ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xe0) = set;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.
             super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
             super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xe8))->
  _M_allocated_capacity = local_48;
  *(undefined8 *)
   ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xf0) = uStack_40;
  local_50._M_t.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
       super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl;
  AddOption(this,(OptionPtr *)&local_50);
  if ((_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
      super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl != (SolverOption *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
                          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 8))();
    return;
  }
  return;
}

Assistant:

void AddIntOption(const char *name,
                    const char *description, Int (Handler::*get)(const SolverOption &) const,
                    void (Handler::*set)(const SolverOption &, Int)) {
    AddOption(OptionPtr(new ConcreteOption<Handler, fmt::LongLong, Int>(
                          name, description, this, get, set)));
  }